

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

bool __thiscall czh::node::Node::get<bool>(Node *this,source_location *l)

{
  bool bVar1;
  __index_type _Var2;
  variant_alternative_t<1UL,_variant<NodeData,_Value>_> *this_00;
  Node *this_01;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  assert_value(this,l);
  this_00 = std::get<1ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
  _Var2 = *(__index_type *)
           ((long)&(this_00->value).
                   super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                   .
                   super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
           + 0x20);
  if (_Var2 == '\x06') {
    bVar1 = std::type_info::operator==
                      ((type_info *)&bool::typeinfo,(type_info *)&value::Reference::typeinfo);
    if (!bVar1) {
      local_d0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001955c8;
      value::Value::internal_get<czh::value::Reference>(&local_f0,this_00);
      this_01 = get_end_of_list_of_ref(this,(Reference *)&local_f0,l);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Can not get a circular reference.",
                 (allocator<char> *)&local_d0);
      if (this_01 == (Node *)0x0) {
        report_error(&local_f0,&this->czh_token,l);
      }
      std::__cxx11::string::~string((string *)&local_f0);
      local_f0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001955e0;
      bVar1 = get<bool>(this_01,(source_location *)&local_f0);
      return bVar1;
    }
    _Var2 = *(__index_type *)
             ((long)&(this_00->value).
                     super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                     .
                     super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
             + 0x20);
  }
  if (_Var2 != '\x04') {
    local_30._M_len = 0x39;
    local_30._M_str = "std::string_view czh::value::details::nameof() [T = bool]";
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_90,&local_30,&local_f1);
    std::operator+(&local_70,"The value is not \'",&local_90);
    std::operator+(&local_50,&local_70,"\'.[Actual T = \'");
    value::Value::get_typename_abi_cxx11_(&local_b0,this_00);
    std::operator+(&local_d0,&local_50,&local_b0);
    std::operator+(&local_f0,&local_d0,"\'].");
    report_error(&local_f0,&this->czh_token,l);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_f0._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_001955f8;
  bVar1 = value::Value::internal_get<bool>(this_00);
  return bVar1;
}

Assistant:

T get(const std::source_location &l =
    std::source_location::current()) const
    {
      assert_value(l);
      auto &value = std::get<Value>(data);
      if (value.is<value::Reference>() && typeid(T) != typeid(value::Reference))
      {
        auto ptr = get_end_of_list_of_ref(value.get<value::Reference>(), l);
        assert_true(ptr != nullptr, "Can not get a circular reference.", czh_token, l);
        return ptr->get<T>();
      }
  
      if (!value.can_get<T>())
      {
        report_error("The value is not '" + std::string(value::details::nameof<T>()) + "'.[Actual T = '"
                     + value.get_typename() + "'].", czh_token, l);
      }
      return value.get<T>();
    }